

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mesh_function_unary.h
# Opt level: O3

vector<lf::mesh::utils::test::X,_std::allocator<lf::mesh::utils::test::X>_> * __thiscall
lf::mesh::utils::
MeshFunctionUnary<lf::mesh::utils::internal::UnaryOpMinus,_lf::mesh::utils::MeshFunctionConstant<lf::mesh::utils::test::X>_>
::operator()(vector<lf::mesh::utils::test::X,_std::allocator<lf::mesh::utils::test::X>_>
             *__return_storage_ptr__,
            MeshFunctionUnary<lf::mesh::utils::internal::UnaryOpMinus,_lf::mesh::utils::MeshFunctionConstant<lf::mesh::utils::test::X>_>
            *this,Entity *e,MatrixXd *local)

{
  allocator_type local_31;
  vector<lf::mesh::utils::test::X,_std::allocator<lf::mesh::utils::test::X>_> local_30;
  
  std::vector<lf::mesh::utils::test::X,_std::allocator<lf::mesh::utils::test::X>_>::vector
            (&local_30,
             (local->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.
             m_cols,&(this->mf_).value_,&local_31);
  internal::UnaryOpMinus::operator()(__return_storage_ptr__,(UnaryOpMinus *)this,&local_30,0);
  if (local_30.
      super__Vector_base<lf::mesh::utils::test::X,_std::allocator<lf::mesh::utils::test::X>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_30.
                    super__Vector_base<lf::mesh::utils::test::X,_std::allocator<lf::mesh::utils::test::X>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_30.
                          super__Vector_base<lf::mesh::utils::test::X,_std::allocator<lf::mesh::utils::test::X>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_30.
                          super__Vector_base<lf::mesh::utils::test::X,_std::allocator<lf::mesh::utils::test::X>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  return __return_storage_ptr__;
}

Assistant:

auto operator()(const mesh::Entity& e, const Eigen::MatrixXd& local) const {
    return op_(mf_(e, local), 0);
  }